

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicalAnalysis.cpp
# Opt level: O2

void clearToken(void)

{
  if (lastChar != -1) {
    Token = IDENFR;
    tokenToLower[0] = '\0';
    token[0] = '\0';
    charPointer = 0;
    return;
  }
  Char = -1;
  return;
}

Assistant:

void clearToken() {
    if (lastChar != -1) {
        Token = IDENFR;
        tokenToLower[0] = '\0';
        token[0] = '\0';
        charPointer = 0;
    } else {
        Char = lastChar;
    }
}